

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_integer.c
# Opt level: O0

int aom_uleb_decode(uint8_t *buffer,size_t available,uint64_t *value,size_t *length)

{
  uint8_t decoded_byte;
  size_t i;
  size_t *length_local;
  uint64_t *value_local;
  size_t available_local;
  uint8_t *buffer_local;
  
  if ((buffer != (uint8_t *)0x0) && (value != (uint64_t *)0x0)) {
    *value = 0;
    for (i = 0; i < 8 && i < available; i = i + 1) {
      *value = (ulong)(buffer[i] & 0x7f) << ((char)i * '\a' & 0x3fU) | *value;
      if ((int)(uint)buffer[i] >> 7 == 0) {
        if (length != (size_t *)0x0) {
          *length = i + 1;
        }
        if (0xffffffff < *value) {
          return -1;
        }
        return 0;
      }
    }
  }
  return -1;
}

Assistant:

int aom_uleb_decode(const uint8_t *buffer, size_t available, uint64_t *value,
                    size_t *length) {
  if (buffer && value) {
    *value = 0;
    for (size_t i = 0; i < kMaximumLeb128Size && i < available; ++i) {
      const uint8_t decoded_byte = *(buffer + i) & kLeb128ByteMask;
      *value |= ((uint64_t)decoded_byte) << (i * 7);
      if ((*(buffer + i) >> 7) == 0) {
        if (length) {
          *length = i + 1;
        }

        // Fail on values larger than 32-bits to ensure consistent behavior on
        // 32 and 64 bit targets: value is typically used to determine buffer
        // allocation size.
        if (*value > UINT32_MAX) return -1;

        return 0;
      }
    }
  }

  // If we get here, either the buffer/value pointers were invalid,
  // or we ran over the available space
  return -1;
}